

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O2

CharClass<char> * __thiscall
Centaurus::CharClass<char>::operator|=(CharClass<char> *this,CharClass<char> *cc)

{
  CharClass<char> local_30;
  
  operator|(&local_30,this,cc);
  std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::_M_move_assign
            (&this->m_ranges,&local_30.m_ranges);
  ~CharClass(&local_30);
  return this;
}

Assistant:

CharClass<TCHAR>& operator|=(const CharClass<TCHAR>& cc)
    {
        return *this = *this | cc;
    }